

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O3

void __thiscall ControlParser::initializeControlSettings(ControlParser *this)

{
  this->controlType = -1;
  this->link = (Link *)0x0;
  this->linkStatus = 2;
  this->nodeSetting = 0.0;
  this->linkSetting = 0.0;
  this->node = (Node *)0x0;
  this->levelType = 0;
  this->timeSetting = -1;
  return;
}

Assistant:

void ControlParser::initializeControlSettings()
{
    //... initialize control parameters
    controlType = -1;
    link = 0;
    linkStatus = Control::NO_STATUS;
    linkSetting = 0.0;
    node = 0;
    levelType = Control::LOW_LEVEL;
    nodeSetting = 0.0;
    timeSetting = -1;
}